

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O3

bool __thiscall
cmCTestBuildCommand::InitialPass
          (cmCTestBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  uint uVar1;
  cmMakefile *this_00;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  string_view value;
  string_view value_00;
  string __str;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  cmMakefile *local_38;
  
  bVar4 = cmCTestHandlerCommand::InitialPass(&this->super_cmCTestHandlerCommand,args,status);
  if ((this->NumberErrors)._M_string_length != 0) {
    local_38 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    uVar1 = this->Handler->TotalErrors;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar7 = 1;
    if (9 < uVar2) {
      uVar6 = (ulong)uVar2;
      uVar3 = 4;
      do {
        uVar7 = uVar3;
        uVar5 = (uint)uVar6;
        if (uVar5 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_0023bc88;
        }
        if (uVar5 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_0023bc88;
        }
        if (uVar5 < 10000) goto LAB_0023bc88;
        uVar6 = uVar6 / 10000;
        uVar3 = uVar7 + 4;
      } while (99999 < uVar5);
      uVar7 = uVar7 + 1;
    }
LAB_0023bc88:
    local_58 = local_48;
    std::__cxx11::string::_M_construct((ulong)&local_58,(char)uVar7 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_58 + (ulong)(uVar1 >> 0x1f)),uVar7,uVar2);
    value._M_str = (char *)local_58;
    value._M_len = local_50;
    cmMakefile::AddDefinition(local_38,&this->NumberErrors,value);
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  if ((this->NumberWarnings)._M_string_length != 0) {
    this_00 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    uVar1 = this->Handler->TotalWarnings;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar7 = 1;
    if (9 < uVar2) {
      uVar6 = (ulong)uVar2;
      uVar3 = 4;
      do {
        uVar7 = uVar3;
        uVar5 = (uint)uVar6;
        if (uVar5 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_0023bd74;
        }
        if (uVar5 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_0023bd74;
        }
        if (uVar5 < 10000) goto LAB_0023bd74;
        uVar6 = uVar6 / 10000;
        uVar3 = uVar7 + 4;
      } while (99999 < uVar5);
      uVar7 = uVar7 + 1;
    }
LAB_0023bd74:
    local_58 = local_48;
    std::__cxx11::string::_M_construct((ulong)&local_58,(char)uVar7 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_58 + (ulong)(uVar1 >> 0x1f)),uVar7,uVar2);
    value_00._M_str = (char *)local_58;
    value_00._M_len = local_50;
    cmMakefile::AddDefinition(this_00,&this->NumberWarnings,value_00);
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmCTestBuildCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& status)
{
  bool ret = this->cmCTestHandlerCommand::InitialPass(args, status);
  if (!this->NumberErrors.empty()) {
    this->Makefile->AddDefinition(
      this->NumberErrors, std::to_string(this->Handler->GetTotalErrors()));
  }
  if (!this->NumberWarnings.empty()) {
    this->Makefile->AddDefinition(
      this->NumberWarnings, std::to_string(this->Handler->GetTotalWarnings()));
  }
  return ret;
}